

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LabText.h
# Opt level: O0

char * tsGetString(char *pCurr,char *pEnd,bool recognizeEscapes,char **resultStringBegin,
                  uint32_t *stringLength)

{
  undefined8 *in_RCX;
  byte in_DL;
  char *in_RSI;
  char *in_RDI;
  int *in_R8;
  char *local_8;
  
  local_8 = tsScanForQuote(in_RDI,in_RSI,'\"',(bool)(in_DL & 1));
  if (local_8 < in_RSI) {
    *in_RCX = local_8 + 1;
    local_8 = tsScanForQuote(local_8 + 1,in_RSI,'\"',(bool)(in_DL & 1));
    if (in_RSI < local_8) {
      *in_R8 = 0;
    }
    else {
      *in_R8 = (int)local_8 - (int)*in_RCX;
    }
    local_8 = local_8 + 1;
  }
  else {
    *in_R8 = 0;
  }
  return local_8;
}

Assistant:

char const* tsGetString(
    char const* pCurr, char const* pEnd,
    bool recognizeEscapes,
    char const** resultStringBegin, uint32_t* stringLength)
{
    Assert(pCurr && pEnd && pEnd >= pCurr);

    pCurr = tsScanForQuote(pCurr, pEnd, '\"', recognizeEscapes);

    if (pCurr < pEnd)
    {
        ++pCurr;    // skip past quote
        *resultStringBegin = pCurr;

        pCurr = tsScanForQuote(pCurr, pEnd, '\"', recognizeEscapes);

        if (pCurr <= pEnd)
            *stringLength = (uint32_t)(pCurr - *resultStringBegin);
        else
            *stringLength = 0;

        ++pCurr;    // point past closing quote
    }
    else
        *stringLength = 0;

    return pCurr;
}